

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unsigned_long * __thiscall
kj::_::NullableValue<unsigned_long>::emplace<unsigned_long>
          (NullableValue<unsigned_long> *this,unsigned_long *params)

{
  unsigned_long *params_00;
  unsigned_long *params_local;
  NullableValue<unsigned_long> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<unsigned_long>(&(this->field_1).value);
  }
  params_00 = fwd<unsigned_long>(params);
  ctor<unsigned_long,unsigned_long>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (unsigned_long *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }